

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O0

void * ztparseAlloc(_func_void_ptr_size_t *mallocProc,ztparseinfo_t *info)

{
  void *yypRawParser;
  ztparseinfo_t *in_RSI;
  code *in_RDI;
  yyParser *yypParser;
  
  yypRawParser = (void *)(*in_RDI)(0x660);
  if (yypRawParser != (void *)0x0) {
    *(ztparseinfo_t **)((long)yypRawParser + 0x10) = in_RSI;
    ztparseInit(yypRawParser,in_RSI);
  }
  return yypRawParser;
}

Assistant:

void *ztparseAlloc(void *(*mallocProc)(YYMALLOCARGTYPE) ztparseCTX_PDECL){
  yyParser *yypParser;
  yypParser = (yyParser*)(*mallocProc)( (YYMALLOCARGTYPE)sizeof(yyParser) );
  if( yypParser ){
    ztparseCTX_STORE
    ztparseInit(yypParser ztparseCTX_PARAM);
  }
  return (void*)yypParser;
}